

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O0

HRESULT RunBgParseSync(LPCSTR fileContents,UINT lengthBytes,char *fileName)

{
  DWORD dwBgParseCookie;
  JsErrorCode JVar1;
  WCHAR *pWVar2;
  PAL_FILE *pPVar3;
  DWORD_PTR sourceContext;
  JsValueRef local_280;
  JsValueRef bgResult;
  undefined1 auStack_270 [4];
  DWORD cookie;
  JsScriptContents scriptContents;
  size_t i;
  size_t fileNameLength;
  WCHAR fileNameWide [260];
  JsValueRef pvStack_28;
  JsErrorCode e;
  JsValueRef scriptSource;
  char *fileName_local;
  LPCSTR pCStack_10;
  UINT lengthBytes_local;
  LPCSTR fileContents_local;
  
  scriptSource = fileName;
  fileName_local._4_4_ = lengthBytes;
  pCStack_10 = fileContents;
  fileNameWide._516_4_ =
       ChakraRTInterface::JsCreateExternalArrayBuffer
                 (fileContents,lengthBytes,(JsFinalizeCallback)0x0,fileContents,
                  &stack0xffffffffffffffd8);
  memset(&fileNameLength,0,0x208);
  pWVar2 = (WCHAR *)strlen((char *)scriptSource);
  for (scriptContents.fullPath = (WCHAR *)0x0; scriptContents.fullPath < pWVar2;
      scriptContents.fullPath = (WCHAR *)((long)scriptContents.fullPath + 1)) {
    fileNameWide[(long)(scriptContents.fullPath + -2)] =
         (short)*(char *)((long)scriptSource + (long)scriptContents.fullPath);
  }
  memset(auStack_270,0,0x28);
  _auStack_270 = pCStack_10;
  scriptContents.container._4_4_ = 0;
  scriptContents.container._0_4_ = 0;
  scriptContents.sourceContext = (JsSourceContext)fileName_local._4_4_;
  scriptContents.contentLengthInBytes = (size_t)&fileNameLength;
  bgResult._4_4_ = 0;
  fileNameWide._516_4_ =
       ChakraRTInterface::JsQueueBackgroundParse_Experimental
                 ((JsScriptContents *)auStack_270,(DWORD *)((long)&bgResult + 4));
  if (fileNameWide._516_4_ != JsNoError) {
    pPVar3 = PAL_get_stderr(0);
    PAL_fprintf(pPVar3,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/ch.cpp"
                ,0x2f5);
    pPVar3 = PAL_get_stderr(0);
    PAL_fflush(pPVar3);
    DebugBreak();
  }
  dwBgParseCookie = bgResult._4_4_;
  local_280 = (JsValueRef)0x0;
  sourceContext = WScriptJsrt::GetNextSourceContext();
  JVar1 = ChakraRTInterface::JsExecuteBackgroundParse_Experimental
                    (dwBgParseCookie,pvStack_28,sourceContext,
                     (WCHAR *)scriptContents.contentLengthInBytes,JsParseScriptAttributeNone,
                     (JsValueRef)0x0,&local_280);
  return JVar1;
}

Assistant:

HRESULT RunBgParseSync(LPCSTR fileContents, UINT lengthBytes, const char* fileName)
{
    JsValueRef scriptSource;
    JsErrorCode e = (ChakraRTInterface::JsCreateExternalArrayBuffer((void*)fileContents,
        (unsigned int)lengthBytes,
        nullptr, (void*)fileContents, &scriptSource));

    // What's the preferred way of doing this?
    WCHAR fileNameWide[MAX_PATH] = { 0 };
    size_t fileNameLength = strlen(fileName);
    for (size_t i = 0; i < fileNameLength; i++)
    {
        fileNameWide[i] = fileName[i];
    }

    JsScriptContents scriptContents = { 0 };
    scriptContents.container = (LPVOID)fileContents;
    scriptContents.containerType = JsScriptContainerType::HeapAllocatedBuffer;
    scriptContents.encodingType = JsScriptEncodingType::Utf8;
    scriptContents.contentLengthInBytes = lengthBytes;
    scriptContents.fullPath = fileNameWide;

    DWORD cookie = 0;
    e = ChakraRTInterface::JsQueueBackgroundParse_Experimental(&scriptContents, &cookie);
    Assert(e == JsErrorCode::JsNoError);

    JsValueRef bgResult = nullptr;
    e = ChakraRTInterface::JsExecuteBackgroundParse_Experimental(
        cookie,
        scriptSource,
        WScriptJsrt::GetNextSourceContext(),
        (WCHAR*)scriptContents.fullPath,
        JsParseScriptAttributes::JsParseScriptAttributeNone,
        nullptr,//_In_ JsValueRef parserState,
        &bgResult
    );

    return e;
}